

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_1677::parseComponents(ndicapi *api,char *data)

{
  int iVar1;
  uint itemCount_00;
  unsigned_short itemOption_00;
  ushort uVar2;
  char *data_00;
  uint itemCount;
  unsigned_short itemOption;
  uint componentSize;
  unsigned_short componentType;
  unsigned_short i;
  uint totalSkipLength;
  unsigned_short componentCount;
  char *componentIndex;
  char *data_local;
  ndicapi *api_local;
  
  api->Bx2GBFVersion = *(unsigned_short *)data;
  uVar2 = *(ushort *)(data + 2);
  _totalSkipLength = data + 4;
  for (itemOption = 0; itemOption < uVar2; itemOption = itemOption + 1) {
    iVar1 = *(int *)(_totalSkipLength + 2);
    itemOption_00 = *(unsigned_short *)(_totalSkipLength + 6);
    itemCount_00 = *(uint *)(_totalSkipLength + 8);
    data_00 = _totalSkipLength + 0xc;
    switch(*(undefined2 *)_totalSkipLength) {
    case 1:
      parseFrameComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 2:
      parse6DComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 3:
      parse3DComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 4:
      parse1DComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 5:
      parse2DComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    default:
      break;
    case 8:
      parseLineSepComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 9:
      parse3DErrorComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 0x10:
      parse1DImageComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 0x11:
      parseUVComponent(api,data_00,itemOption_00,itemCount_00);
      break;
    case 0x12:
      parseSystemAlertComponent(api,data_00,itemOption_00,itemCount_00);
    }
    _totalSkipLength = data_00 + (iVar1 - 0xc);
  }
  return;
}

Assistant:

void parseComponents(ndicapi* api, const char* data)
  {
    const char* componentIndex = data;

    // GBF version
    api->Bx2GBFVersion = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;
    // GBF Component count
    unsigned short componentCount = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;

    unsigned int totalSkipLength(0);
    for (unsigned short i = 0; i < componentCount; ++i)
    {
      // Component
      unsigned short componentType = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int componentSize = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;
      unsigned short itemOption = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int itemCount = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;

      switch (componentType)
      {
      case NDI_COMPONENTID_FRAME:
        parseFrameComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_6D:
        parse6DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D:
        parse3DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_1D:
        parse1DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_2D:
        parse2DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_LINE_SEP:
        parseLineSepComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D_ERROR:
        parse3DErrorComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_IMAGE:
        parse1DImageComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_UV:
        parseUVComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_SYS_ALERT:
        parseSystemAlertComponent(api, componentIndex, itemOption, itemCount);
        break;
      default:
        // Unknown component type, do nothing
        break;
      }

      componentIndex += componentSize - 12; // skip component size - header size
    }
  }